

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::custom_op<int>::custom_function<int_const&(*)(int_const&,int_const&)>
               (_func_int_ptr_int_ptr_int_ptr *func,void *invec,void *inoutvec,int *len,
               MPI_Datatype *dt)

{
  size_t __n;
  int iVar1;
  int *piVar2;
  int *piVar3;
  int i;
  long lVar4;
  int inout_buf;
  int in_buf;
  MPI_Aint true_extent;
  MPI_Aint true_lb;
  int local_58;
  int local_54;
  void *local_50;
  size_t local_48;
  MPI_Datatype *local_40;
  long local_38;
  
  iVar1 = *len;
  local_50 = invec;
  local_40 = dt;
  if (1 < iVar1) {
    piVar3 = (int *)inoutvec;
    for (lVar4 = 0; lVar4 < iVar1 + -1; lVar4 = lVar4 + 1) {
      piVar2 = (*func)((int *)invec,piVar3);
      *piVar3 = *piVar2;
      iVar1 = *len;
      piVar3 = piVar3 + 1;
      invec = (void *)((long)invec + 4);
    }
  }
  MPI_Type_get_true_extent(*local_40,&local_38,&local_48);
  lVar4 = local_38;
  __n = local_48;
  iVar1 = *len;
  memcpy((void *)((long)&local_54 + local_38),(void *)((long)local_50 + (long)iVar1 * 4 + -4),
         local_48);
  memcpy((void *)((long)&local_58 + lVar4),(void *)((long)inoutvec + (long)iVar1 * 4 + -4),__n);
  piVar3 = (*func)(&local_54,&local_58);
  local_58 = *piVar3;
  memcpy((void *)((long)inoutvec + (long)*len * 4 + -4),(void *)((long)&local_58 + local_38),
         local_48);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }